

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaV_gettable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  TValue *pTVar2;
  Table *local_68;
  Table *local_60;
  TValue *o1;
  TValue *o2;
  TValue *res;
  Table *h;
  TValue *tm;
  int loop;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  key_local = t;
  do {
    if (99 < tm._4_4_) {
      luaG_runerror(L,"loop in gettable");
      return;
    }
    if (key_local->tt == 5) {
      t_00 = (key_local->value).gc;
      pTVar2 = luaH_get(&t_00->h,key);
      if (pTVar2->tt != 0) {
LAB_00109b64:
        val->value = pTVar2->value;
        val->tt = pTVar2->tt;
        return;
      }
      if ((t_00->h).metatable == (Table *)0x0) {
        local_60 = (Table *)0x0;
      }
      else {
        if ((((t_00->h).metatable)->flags & 1) == 0) {
          local_68 = (Table *)luaT_gettm((t_00->h).metatable,TM_INDEX,L->l_G->tmname[0]);
        }
        else {
          local_68 = (Table *)0x0;
        }
        local_60 = local_68;
      }
      h = local_60;
      if (local_60 == (Table *)0x0) goto LAB_00109b64;
    }
    else {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_INDEX);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    iVar1._0_1_ = h->tt;
    iVar1._1_1_ = h->marked;
    iVar1._2_1_ = h->flags;
    iVar1._3_1_ = h->lsizenode;
    if (iVar1 == 6) {
      callTMres(L,val,(TValue *)h,key_local,key);
      return;
    }
    key_local = (TValue *)h;
    tm._4_4_ = tm._4_4_ + 1;
  } while( true );
}

Assistant:

static void luaV_gettable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
const TValue*res=luaH_get(h,key);
if(!ttisnil(res)||
(tm=fasttm(L,h->metatable,TM_INDEX))==NULL){
setobj(L,val,res);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_INDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTMres(L,val,tm,t,key);
return;
}
t=tm;
}
luaG_runerror(L,"loop in gettable");
}